

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O2

void __thiscall
ServerService::startControlServiceWithResult
          (ServerService *this,int fd,_func_byte_ptr_int_byte_ptr *pFunction)

{
  int recvWindowSize;
  uint __fd;
  int socketFD;
  ServerSegment *pSVar1;
  ostream *poVar2;
  byte *data;
  long lVar3;
  sockaddr_storage *psVar4;
  ServerService *this_00;
  undefined8 *puVar5;
  byte bVar6;
  sockaddr_storage in_stack_fffffffffffff908;
  socklen_t clientLength;
  sockaddr_storage clientDetails;
  byte buffer [1472];
  
  bVar6 = 0;
  memset(buffer,0,0x5c0);
  clientLength = 0x80;
  __fd = ServerSocketUDP::getSocket(this->serverSocketUDP);
  this_00 = (ServerService *)(ulong)__fd;
  recvfrom(__fd,buffer,0x5c0,0,(sockaddr *)&clientDetails,&clientLength);
  pSVar1 = parseRequest(this_00,buffer);
  if ((pSVar1->data != (byte *)0x0) && (pSVar1->ackFlag == 'N')) {
    std::operator<<((ostream *)&std::cout,"received: ");
    poVar2 = std::operator<<((ostream *)&std::cout,(char *)pSVar1->data);
    std::endl<char,std::char_traits<char>>(poVar2);
    data = (*pFunction)(fd,pSVar1->data);
    socketFD = ServerSocketUDP::getSocket(this->serverSocketUDP);
    recvWindowSize = this->receiverWindowSize;
    psVar4 = &clientDetails;
    puVar5 = (undefined8 *)&stack0xfffffffffffff908;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *(undefined8 *)psVar4;
      psVar4 = (sockaddr_storage *)((long)psVar4 + (ulong)bVar6 * -0x10 + 8);
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    sendSegments(this,data,socketFD,in_stack_fffffffffffff908,recvWindowSize);
  }
  return;
}

Assistant:

void ServerService::startControlServiceWithResult(int fd, byte* (* pFunction)(int, byte* )) {
    socklen_t clientLength;
    struct sockaddr_storage clientDetails;
    byte buffer[MTU];
    bzero(buffer, MTU);
    clientLength = sizeof(clientDetails);
    recvfrom(serverSocketUDP->getSocket(), buffer, MTU, 0, (struct sockaddr *) &clientDetails, &clientLength);
    ServerSegment *segment = parseRequest(buffer);

    if (segment->data && segment->ackFlag == 'N') {
        cout << "received: ";
        cout << (char *) segment->data << endl;
        sendSegments(pFunction(fd, segment->data), serverSocketUDP->getSocket(), clientDetails, receiverWindowSize);
    }
}